

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O0

void test_msg_pipe(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  nng_pipe local_1c;
  nng_pipe local_18;
  nng_pipe p0;
  nng_pipe p;
  nng_err result_;
  nng_msg *msg;
  
  p0.id = nng_msg_alloc((nng_msg **)&p,0);
  bVar4 = p0.id == NNG_OK;
  pcVar3 = nng_strerror(p0.id);
  iVar1 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xaf,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         p0.id);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  memset(&local_18,0,4);
  memset(&local_1c,0,4);
  iVar1 = nng_pipe_id(local_1c);
  iVar1 = acutest_check_((uint)(iVar1 < 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xb3,"%s","nng_pipe_id(p0) < 0");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  local_18 = nng_msg_get_pipe(_p);
  iVar1 = nng_pipe_id(local_18);
  iVar1 = acutest_check_((uint)(iVar1 < 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xb5,"%s","nng_pipe_id(p) < 0");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  memset(&local_18,0x22,4);
  nng_msg_set_pipe(_p,local_18);
  local_18 = nng_msg_get_pipe(_p);
  iVar1 = nng_pipe_id(local_18);
  iVar2 = nng_pipe_id(local_1c);
  iVar1 = acutest_check_((uint)(iVar1 != iVar2),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xb9,"%s","nng_pipe_id(p) != nng_pipe_id(p0)");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  iVar1 = nng_pipe_id(local_18);
  iVar1 = acutest_check_((uint)(iVar1 == 0x22222222),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xba,"%s","nng_pipe_id(p) == 0x22222222");
  if (iVar1 == 0) {
    acutest_abort_();
  }
  nng_msg_free(_p);
  return;
}

Assistant:

void
test_msg_pipe(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	nng_pipe p  = NNG_PIPE_INITIALIZER;
	nng_pipe p0 = NNG_PIPE_INITIALIZER;

	NUTS_ASSERT(nng_pipe_id(p0) < 0);
	p = nng_msg_get_pipe(msg);
	NUTS_ASSERT(nng_pipe_id(p) < 0);
	memset(&p, 0x22, sizeof(p));
	nng_msg_set_pipe(msg, p);
	p = nng_msg_get_pipe(msg);
	NUTS_ASSERT(nng_pipe_id(p) != nng_pipe_id(p0));
	NUTS_ASSERT(nng_pipe_id(p) == 0x22222222);

	nng_msg_free(msg);
}